

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_def.c
# Opt level: O0

int count_exts_in_msg(google_protobuf_DescriptorProto *msg_proto)

{
  int iVar1;
  google_protobuf_DescriptorProto **ppgVar2;
  ulong local_30;
  size_t i;
  google_protobuf_DescriptorProto **nested_msgs;
  ulong uStack_18;
  int ext_count;
  size_t n;
  google_protobuf_DescriptorProto *msg_proto_local;
  
  n = (size_t)msg_proto;
  google_protobuf_DescriptorProto_extension(msg_proto,&stack0xffffffffffffffe8);
  nested_msgs._4_4_ = (int)uStack_18;
  ppgVar2 = google_protobuf_DescriptorProto_nested_type
                      ((google_protobuf_DescriptorProto *)n,&stack0xffffffffffffffe8);
  for (local_30 = 0; local_30 < uStack_18; local_30 = local_30 + 1) {
    iVar1 = count_exts_in_msg(ppgVar2[local_30]);
    nested_msgs._4_4_ = iVar1 + nested_msgs._4_4_;
  }
  return nested_msgs._4_4_;
}

Assistant:

static int count_exts_in_msg(const UPB_DESC(DescriptorProto) * msg_proto) {
  size_t n;
  UPB_DESC(DescriptorProto_extension)(msg_proto, &n);
  int ext_count = n;

  const UPB_DESC(DescriptorProto)* const* nested_msgs =
      UPB_DESC(DescriptorProto_nested_type)(msg_proto, &n);
  for (size_t i = 0; i < n; i++) {
    ext_count += count_exts_in_msg(nested_msgs[i]);
  }

  return ext_count;
}